

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_TimedText.cpp
# Opt level: O0

h__Reader * __thiscall
AS_02::TimedText::MXFReader::h__Reader::MD_to_TimedText_TDesc
          (h__Reader *this,TimedTextDescriptor *TDesc)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  unsigned_long_long *puVar4;
  byte_t *pbVar5;
  long lVar6;
  reference __y;
  ILogSink *this_00;
  undefined8 *in_RDX;
  pair<const_Kumu::UUID,_Kumu::UUID> local_188;
  undefined1 local_144 [8];
  TimedTextResourceDescriptor TmpResource;
  InterchangeObject *tmp_iobj;
  __normal_iterator<Kumu::UUID_*,_std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_> local_b0;
  Result_t local_a8 [8];
  Result_t result;
  TimedTextResourceSubDescriptor *DescObject;
  __normal_iterator<const_Kumu::UUID_*,_std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>
  local_30;
  const_iterator sdi;
  TimedTextDescriptor *TDescObj;
  TimedTextDescriptor *TDesc_local;
  h__Reader *this_local;
  
  if (*(long *)&TDesc[8].EncodingName == 0) {
    __assert_fail("m_EssenceDescriptor",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_02_TimedText.cpp"
                  ,0x59,
                  "ASDCP::Result_t AS_02::TimedText::MXFReader::h__Reader::MD_to_TimedText_TDesc(TimedTextDescriptor &)"
                 );
  }
  memset((void *)((long)&TDesc[8].RFC5646LanguageTagList._M_string_length + 4),0,0x10);
  sdi._M_current = *(UUID **)&TDesc[8].EncodingName;
  *in_RDX = *(undefined8 *)(sdi._M_current[7].super_Identifier<16U>.m_Value + 7);
  bVar1 = ASDCP::MXF::optional_property<unsigned_long_long>::empty
                    ((optional_property<unsigned_long_long> *)
                     (sdi._M_current[7].super_Identifier<16U>.m_Value + 0xf));
  if (!bVar1) {
    puVar4 = ASDCP::MXF::optional_property::operator_cast_to_unsigned_long_long_
                       ((optional_property *)(sdi._M_current[7].super_Identifier<16U>.m_Value + 0xf)
                       );
    if (0xffffffff < *puVar4) {
      __assert_fail("TDescObj->ContainerDuration <= 0xFFFFFFFFL",
                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_02_TimedText.cpp"
                    ,0x60,
                    "ASDCP::Result_t AS_02::TimedText::MXFReader::h__Reader::MD_to_TimedText_TDesc(TimedTextDescriptor &)"
                   );
    }
    puVar4 = ASDCP::MXF::optional_property::operator_cast_to_unsigned_long_long_
                       ((optional_property *)(sdi._M_current[7].super_Identifier<16U>.m_Value + 0xf)
                       );
    *(int *)(in_RDX + 1) = (int)*puVar4;
  }
  pbVar5 = Kumu::Identifier<16U>::Value
                     ((Identifier<16U> *)(sdi._M_current[0xb].super_Identifier<16U>.m_Value + 7));
  *(undefined8 *)((long)in_RDX + 0xc) = *(undefined8 *)pbVar5;
  *(undefined8 *)((long)in_RDX + 0x14) = *(undefined8 *)(pbVar5 + 8);
  std::__cxx11::string::operator=((string *)(in_RDX + 4),(string *)(sdi._M_current + 0xe));
  std::__cxx11::string::operator=
            ((string *)(in_RDX + 8),
             (string *)(sdi._M_current[0xc].super_Identifier<16U>.m_Value + 0xf));
  DescObject = (TimedTextResourceSubDescriptor *)
               std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>::begin
                         ((vector<Kumu::UUID,_std::allocator<Kumu::UUID>_> *)
                          &sdi._M_current[6].super_Identifier<16U>.m_HasValue);
  __gnu_cxx::__normal_iterator<Kumu::UUID_const*,std::vector<Kumu::UUID,std::allocator<Kumu::UUID>>>
  ::__normal_iterator<Kumu::UUID*>
            ((__normal_iterator<Kumu::UUID_const*,std::vector<Kumu::UUID,std::allocator<Kumu::UUID>>>
              *)&local_30,
             (__normal_iterator<Kumu::UUID_*,_std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>
              *)&DescObject);
  Kumu::Result_t::Result_t(local_a8,(Result_t *)Kumu::RESULT_OK);
  while( true ) {
    local_b0._M_current =
         (UUID *)std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>::end
                           ((vector<Kumu::UUID,_std::allocator<Kumu::UUID>_> *)
                            &sdi._M_current[6].super_Identifier<16U>.m_HasValue);
    bVar2 = __gnu_cxx::operator!=(&local_30,&local_b0);
    bVar1 = false;
    if (bVar2) {
      iVar3 = Kumu::Result_t::operator_cast_to_int(local_a8);
      bVar1 = -1 < iVar3;
    }
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_Kumu::UUID_*,_std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>::
    operator*(&local_30);
    ASDCP::MXF::OP1aHeader::GetMDObjectByID
              ((UUID *)(TmpResource.ResourceID + 0xc),(InterchangeObject **)(TDesc->AssetID + 0xc));
    Kumu::Result_t::operator=(local_a8,(Result_t *)(TmpResource.ResourceID + 0xc));
    Kumu::Result_t::~Result_t((Result_t *)(TmpResource.ResourceID + 0xc));
    iVar3 = Kumu::Result_t::operator_cast_to_int(local_a8);
    if (iVar3 < 0) {
      this_00 = (ILogSink *)Kumu::DefaultLogSink();
      Kumu::ILogSink::Error(this_00,"Broken sub-descriptor link\n");
      Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)ASDCP::RESULT_FORMAT);
LAB_001a9b50:
      Kumu::Result_t::~Result_t(local_a8);
      return this;
    }
    ASDCP::TimedText::TimedTextResourceDescriptor::TimedTextResourceDescriptor
              ((TimedTextResourceDescriptor *)local_144);
    pbVar5 = Kumu::Identifier<16U>::Value((Identifier<16U> *)0xa0);
    local_144 = *(undefined1 (*) [8])pbVar5;
    TmpResource.ResourceID._0_8_ = *(undefined8 *)(pbVar5 + 8);
    lVar6 = std::__cxx11::string::find((char *)0xc8,0x1c635d);
    if (((lVar6 == -1) && (lVar6 = std::__cxx11::string::find((char *)0xc8,0x1c6609), lVar6 == -1))
       && (lVar6 = std::__cxx11::string::find((char *)0xc8,0x1c6620), lVar6 == -1)) {
      lVar6 = std::__cxx11::string::find((char *)0xc8,0x1c6353);
      TmpResource.ResourceID[9] = '\0';
      TmpResource.ResourceID[10] = '\0';
      TmpResource.ResourceID[0xb] = '\0';
      TmpResource.ResourceID[8] = lVar6 != -1;
    }
    else {
      TmpResource.ResourceID[8] = '\x02';
      TmpResource.ResourceID[9] = '\0';
      TmpResource.ResourceID[10] = '\0';
      TmpResource.ResourceID[0xb] = '\0';
    }
    std::__cxx11::
    list<ASDCP::TimedText::TimedTextResourceDescriptor,_std::allocator<ASDCP::TimedText::TimedTextResourceDescriptor>_>
    ::push_back((list<ASDCP::TimedText::TimedTextResourceDescriptor,_std::allocator<ASDCP::TimedText::TimedTextResourceDescriptor>_>
                 *)(in_RDX + 0xc),(value_type *)local_144);
    __y = __gnu_cxx::
          __normal_iterator<const_Kumu::UUID_*,_std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>
          ::operator*(&local_30);
    std::pair<const_Kumu::UUID,_Kumu::UUID>::pair<Kumu::UUID_&,_true>(&local_188,(UUID *)0xa0,__y);
    std::
    map<Kumu::UUID,_Kumu::UUID,_std::less<Kumu::UUID>,_std::allocator<std::pair<const_Kumu::UUID,_Kumu::UUID>_>_>
    ::insert((map<Kumu::UUID,_Kumu::UUID,_std::less<Kumu::UUID>,_std::allocator<std::pair<const_Kumu::UUID,_Kumu::UUID>_>_>
              *)&TDesc[8].EncodingName._M_string_length,&local_188);
    std::pair<const_Kumu::UUID,_Kumu::UUID>::~pair(&local_188);
    __gnu_cxx::
    __normal_iterator<const_Kumu::UUID_*,_std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>::
    operator++(&local_30,0);
  }
  Kumu::Result_t::Result_t((Result_t *)this,local_a8);
  goto LAB_001a9b50;
}

Assistant:

ASDCP::Result_t
AS_02::TimedText::MXFReader::h__Reader::MD_to_TimedText_TDesc(TimedTextDescriptor& TDesc)
{
  assert(m_EssenceDescriptor);
  memset(&m_TDesc.AssetID, 0, UUIDlen);
  ASDCP::MXF::TimedTextDescriptor* TDescObj = (ASDCP::MXF::TimedTextDescriptor*)m_EssenceDescriptor;

  TDesc.EditRate = TDescObj->SampleRate;
  if ( ! TDescObj->ContainerDuration.empty() )
    {
      assert(TDescObj->ContainerDuration <= 0xFFFFFFFFL);
      TDesc.ContainerDuration = (ui32_t) TDescObj->ContainerDuration;
    }
  memcpy(TDesc.AssetID, TDescObj->ResourceID.Value(), UUIDlen);
  TDesc.NamespaceName = TDescObj->NamespaceURI;
  TDesc.EncodingName = TDescObj->UCSEncoding;

  Array<Kumu::UUID>::const_iterator sdi = TDescObj->SubDescriptors.begin();
  TimedTextResourceSubDescriptor* DescObject = 0;
  Result_t result = RESULT_OK;

  for ( ; sdi != TDescObj->SubDescriptors.end() && KM_SUCCESS(result); sdi++ )
    {
      InterchangeObject* tmp_iobj = 0;
      result = m_HeaderPart.GetMDObjectByID(*sdi, &tmp_iobj);
      DescObject = static_cast<TimedTextResourceSubDescriptor*>(tmp_iobj);

      if ( KM_SUCCESS(result) )
	{
	  TimedTextResourceDescriptor TmpResource;
	  memcpy(TmpResource.ResourceID, DescObject->AncillaryResourceID.Value(), UUIDlen);

	  if ( DescObject->MIMEMediaType.find("application/x-font-opentype") != std::string::npos
	       || DescObject->MIMEMediaType.find("application/x-opentype") != std::string::npos
	       || DescObject->MIMEMediaType.find("font/opentype") != std::string::npos )
	    {
	      TmpResource.Type = ASDCP::TimedText::MT_OPENTYPE;
	    }
	  else if ( DescObject->MIMEMediaType.find("image/png") != std::string::npos )
	    {
	      TmpResource.Type = ASDCP::TimedText::MT_PNG;
	    }
	  else
	    {
	      TmpResource.Type = ASDCP::TimedText::MT_BIN;
	    }

	  TDesc.ResourceList.push_back(TmpResource);
	  m_ResourceMap.insert(ResourceMap_t::value_type(DescObject->AncillaryResourceID, *sdi));
	}
      else
	{
	  DefaultLogSink().Error("Broken sub-descriptor link\n");
	  return RESULT_FORMAT;
	}
    }

  return result;
}